

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFFileSpecObjectHelper::getEmbeddedFileStream(QPDFFileSpecObjectHelper *this,string *key)

{
  element_type *this_00;
  pointer pbVar1;
  bool bVar2;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  pointer pbVar4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle ef;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_60._16_8_ = key->_M_string_length;
  local_60._24_8_ = (key->field_2)._M_allocated_capacity;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_)->_M_use_count + 1;
    }
  }
  local_40._M_allocated_capacity = (size_type)local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"/EF","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_60,(string *)(local_60 + 0x10));
  if ((long *)local_40._M_allocated_capacity != local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_);
  }
  bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_60);
  pbVar1 = name_keys_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar2) {
    if (*(long *)(in_RDX + 8) != 0) {
      QVar5 = QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_60);
      _Var3._M_pi = QVar5.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_00167426;
    }
    if (name_keys_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        name_keys_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar4 = name_keys_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_60);
        bVar2 = QPDFObjectHandle::isStream((QPDFObjectHandle *)this);
        _Var3._M_pi = extraout_RDX;
        if (bVar2) goto LAB_00167426;
        this_00 = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (this_00 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar1);
    }
  }
  QVar5 = QPDFObjectHandle::newNull();
  _Var3._M_pi = QVar5.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_00167426:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    _Var3._M_pi = extraout_RDX_00;
  }
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFileSpecObjectHelper::getEmbeddedFileStream(std::string const& key)
{
    auto ef = oh().getKey("/EF");
    if (!ef.isDictionary()) {
        return QPDFObjectHandle::newNull();
    }
    if (!key.empty()) {
        return ef.getKey(key);
    }
    for (auto const& i: name_keys) {
        auto k = ef.getKey(i);
        if (k.isStream()) {
            return k;
        }
    }
    return QPDFObjectHandle::newNull();
}